

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5StorageSaveTotals(Fts5Storage *p)

{
  Fts5Index *p_00;
  u8 *p_01;
  int iVar1;
  long lVar2;
  long lVar3;
  Fts5Buffer buf;
  int local_4c;
  Fts5Buffer local_48;
  
  lVar2 = (long)p->pConfig->nCol;
  local_4c = 0;
  local_48.p = (u8 *)0x0;
  local_48.n = 0;
  local_48.nSpace = 0;
  sqlite3Fts5BufferAppendVarint(&local_4c,&local_48,p->nTotalRow);
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      sqlite3Fts5BufferAppendVarint(&local_4c,&local_48,p->aTotalSize[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  p_01 = local_48.p;
  iVar1 = local_4c;
  if (local_4c == 0) {
    p_00 = p->pIndex;
    fts5DataWrite(p_00,1,local_48.p,local_48.n);
    iVar1 = p_00->rc;
    p_00->rc = 0;
  }
  sqlite3_free(p_01);
  return iVar1;
}

Assistant:

static int fts5StorageSaveTotals(Fts5Storage *p){
  int nCol = p->pConfig->nCol;
  int i;
  Fts5Buffer buf;
  int rc = SQLITE_OK;
  memset(&buf, 0, sizeof(buf));

  sqlite3Fts5BufferAppendVarint(&rc, &buf, p->nTotalRow);
  for(i=0; i<nCol; i++){
    sqlite3Fts5BufferAppendVarint(&rc, &buf, p->aTotalSize[i]);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexSetAverages(p->pIndex, buf.p, buf.n);
  }
  sqlite3_free(buf.p);

  return rc;
}